

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::ReceiveGarbage(V2TransportTester *this)

{
  bool bVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  unit_test_log_t *in_RDI;
  long in_FS_OFFSET;
  size_t garblen;
  Span<const_std::byte> term_span;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  BIP324Cipher *in_stack_fffffffffffffe98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  size_t in_stack_fffffffffffffea0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffea8;
  const_string *in_stack_fffffffffffffeb0;
  undefined1 *line_num;
  lazy_ostream *in_stack_fffffffffffffec0;
  const_iterator in_stack_fffffffffffffed0;
  ulong local_108;
  Span<const_std::byte> local_c0 [2];
  Span<unsigned_char> local_a0;
  Span<const_std::byte> local_90;
  const_string local_80;
  assertion_result local_40;
  undefined1 local_28 [16];
  const_string local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_108 = 0; local_108 < 0x1000; local_108 = local_108 + 1) {
    do {
      in_stack_fffffffffffffeb0 = &local_18;
      in_stack_fffffffffffffea8._M_current =
           (uchar *)boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
                 (pointer)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (unsigned_long)in_stack_fffffffffffffe88);
      line_num = local_28;
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe88);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_RDI,(const_string *)in_stack_fffffffffffffec0,(size_t)line_num,
                 in_stack_fffffffffffffeb0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe88)
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffe98,(bool)in_stack_fffffffffffffe97);
      in_stack_fffffffffffffec0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
                 (pointer)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (unsigned_long)in_stack_fffffffffffffe88);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffe88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,
                 (pointer)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (unsigned_long)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe88 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_40,(lazy_ostream *)&stack0xffffffffffffffa0,&local_80,0x4e1,REQUIRE,
                 CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffe88);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe88);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char> *)in_stack_fffffffffffffe98,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    local_a0 = Span<unsigned_char>::subspan
                         ((Span<unsigned_char> *)in_stack_fffffffffffffea8._M_current,
                          in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    local_90 = MakeByteSpan<Span<unsigned_char>>((Span<unsigned_char> *)in_stack_fffffffffffffe98);
    local_c0[0] = BIP324Cipher::GetReceiveGarbageTerminator(in_stack_fffffffffffffe98);
    bVar1 = std::ranges::__equal_fn::
            operator()<Span<const_std::byte>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,&local_90,local_c0);
    if (bVar1) break;
  }
  this_00 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)(in_RDI + 0x114);
  __last._M_current = (uchar *)(in_RDI + 0x11a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  __first = __gnu_cxx::
            __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator+(this_00,CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe88,
             in_stack_fffffffffffffea8,__last);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)this_00,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+(this_00,CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+(this_00,CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)this_00,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0,
             (const_iterator)__first._M_current,in_stack_fffffffffffffed0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ReceiveGarbage()
    {
        // Figure out the garbage length.
        size_t garblen;
        for (garblen = 0; garblen <= V2Transport::MAX_GARBAGE_LEN; ++garblen) {
            BOOST_REQUIRE(m_received.size() >= garblen + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
            auto term_span = MakeByteSpan(Span{m_received}.subspan(garblen, BIP324Cipher::GARBAGE_TERMINATOR_LEN));
            if (std::ranges::equal(term_span, m_cipher.GetReceiveGarbageTerminator())) break;
        }
        // Copy the garbage to a buffer.
        m_recv_garbage.assign(m_received.begin(), m_received.begin() + garblen);
        // Strip garbage + garbage terminator off the front of the receive buffer.
        m_received.erase(m_received.begin(), m_received.begin() + garblen + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
    }